

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

precise_unit units::get_unit(string *unit_string,uint64_t match_flags)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  pointer pvVar4;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  precise_unit pVar8;
  precise_unit actUnit;
  precise_unit actUnit_00;
  unit_data local_c4;
  undefined1 local_c0 [22];
  uint16_t local_aa;
  char *pcStack_a8;
  uint16_t num_2;
  char *ptr_2;
  string *local_98;
  uint16_t local_8a;
  char *pcStack_88;
  uint16_t num_1;
  char *ptr_1;
  string *local_78;
  uint16_t local_6a;
  char *pcStack_68;
  uint16_t num;
  char *ptr;
  size_t index;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
  _Stack_50;
  value_type c;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
  local_48;
  const_iterator fnd;
  uint64_t cdomain;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
  local_30;
  iterator fnd2;
  uint64_t match_flags_local;
  string *unit_string_local;
  precise_unit dmunit;
  
  fnd2.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
             )(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
               )match_flags;
  bVar1 = std::atomic<bool>::load((atomic<bool> *)&allowUserDefinedUnits,memory_order_acquire);
  if ((bVar1) &&
     (bVar1 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
              ::empty((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
                       *)user_defined_units_abi_cxx11_), !bVar1)) {
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
         ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
                 *)user_defined_units_abi_cxx11_,unit_string);
    cdomain = (uint64_t)
              std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
              ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
                     *)user_defined_units_abi_cxx11_);
    bVar1 = std::__detail::operator!=
                      (&local_30,
                       (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
                        *)&cdomain);
    if (bVar1) {
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_false,_true>
                             *)&local_30);
      return ppVar3->second;
    }
  }
  fnd.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
             )getCurrentDomain((uint64_t)
                               fnd2.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
                               ._M_cur);
  if (fnd.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
      ._M_cur != (__node_type *)0x0) {
    _unit_string_local =
         getDomainUnit((uint64_t)
                       fnd.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
                       ._M_cur,unit_string);
    bVar1 = is_valid((precise_unit *)&unit_string_local);
    if (bVar1) {
      return _unit_string_local;
    }
  }
  local_48._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
       ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
               *)base_unit_vals_abi_cxx11_,unit_string);
  _Stack_50._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
              *)base_unit_vals_abi_cxx11_);
  bVar1 = std::__detail::operator!=(&local_48,&stack0xffffffffffffffb0);
  if (bVar1) {
    pvVar4 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_false,_true>
                           *)&local_48);
    _unit_string_local = pvVar4->second;
  }
  else {
    pcVar5 = (char *)std::__cxx11::string::front();
    index._7_1_ = *pcVar5;
    if (((index._7_1_ == 'C') || (index._7_1_ == 'E')) &&
       (uVar6 = std::__cxx11::string::size(), 5 < uVar6)) {
      ptr = (char *)0x0;
      pcVar5 = "CXUN[";
      iVar2 = std::__cxx11::string::compare((ulong)unit_string,0,(char *)0x5);
      if ((iVar2 == 0) && (bVar1 = hasAdditionalOps(unit_string), !bVar1)) {
        pcStack_68 = (char *)0x0;
        lVar7 = std::__cxx11::string::c_str();
        lVar7 = strtol((char *)(lVar7 + 5),&stack0xffffffffffffff98,0);
        local_6a = (uint16_t)lVar7;
        if (*pcStack_68 == ']') {
          _ptr_1 = precise::generate_custom_unit(local_6a);
          pVar8._8_8_ = &ptr;
          pVar8.multiplier_ = (double)ptr_1;
          pVar8 = commoditizedUnit((units *)unit_string,local_78,pVar8,(size_t *)pcVar5);
          return pVar8;
        }
      }
      pcVar5 = "CXCUN[";
      iVar2 = std::__cxx11::string::compare((ulong)unit_string,0,(char *)0x6);
      if ((iVar2 == 0) && (bVar1 = hasAdditionalOps(unit_string), !bVar1)) {
        pcStack_88 = (char *)0x0;
        lVar7 = std::__cxx11::string::c_str();
        lVar7 = strtol((char *)(lVar7 + 6),&stack0xffffffffffffff78,0);
        local_8a = (uint16_t)lVar7;
        if (*pcStack_88 == ']') {
          _ptr_2 = precise::generate_custom_count_unit(local_8a);
          actUnit._8_8_ = &ptr;
          actUnit.multiplier_ = (double)ptr_2;
          pVar8 = commoditizedUnit((units *)unit_string,local_98,actUnit,(size_t *)pcVar5);
          return pVar8;
        }
      }
      pcVar5 = "EQXUN[";
      iVar2 = std::__cxx11::string::compare((ulong)unit_string,0,(char *)0x6);
      if ((iVar2 == 0) && (bVar1 = hasAdditionalOps(unit_string), !bVar1)) {
        pcStack_a8 = (char *)0x0;
        lVar7 = std::__cxx11::string::c_str();
        lVar7 = strtol((char *)(lVar7 + 6),&stack0xffffffffffffff58,0);
        local_aa = (uint16_t)lVar7;
        if (*pcStack_a8 == ']') {
          local_c4 = precise::custom::equation_unit(local_aa);
          precise_unit::precise_unit((precise_unit *)local_c0,&local_c4);
          actUnit_00._8_8_ = &ptr;
          actUnit_00.multiplier_ = (double)local_c0._0_8_;
          pVar8 = commoditizedUnit((units *)unit_string,(string *)local_c0._8_8_,actUnit_00,
                                   (size_t *)pcVar5);
          return pVar8;
        }
      }
    }
    dmunit.multiplier_ = 2.07707442941207e-314;
    unit_string_local = (string *)0x7ff4000000000000;
  }
  return _unit_string_local;
}

Assistant:

static precise_unit
    get_unit(const std::string& unit_string, std::uint64_t match_flags)
{
    if (allowUserDefinedUnits.load(std::memory_order_acquire)) {
        if (!user_defined_units.empty()) {
            auto fnd2 = user_defined_units.find(unit_string);
            if (fnd2 != user_defined_units.end()) {
                return fnd2->second;
            }
        }
    }

    auto cdomain = getCurrentDomain(match_flags);
    if (cdomain != domains::defaultDomain) {
        auto dmunit = getDomainUnit(cdomain, unit_string);
        if (is_valid(dmunit)) {
            return dmunit;
        }
    }

    auto fnd = base_unit_vals.find(unit_string);
    if (fnd != base_unit_vals.end()) {
        return fnd->second;
    }
    // empty string would have been found already
    auto c = unit_string.front();
    if ((c == 'C' || c == 'E') && unit_string.size() >= 6) {
        size_t index{0};
        if (unit_string.compare(0, 5, "CXUN[") == 0) {
            if (!hasAdditionalOps(unit_string)) {
                char* ptr = nullptr;
                auto num = static_cast<std::uint16_t>(
                    strtol(unit_string.c_str() + 5, &ptr, 0));
                if (*ptr == ']') {
                    return commoditizedUnit(
                        unit_string, precise::generate_custom_unit(num), index);
                }
            }
        }
        if (unit_string.compare(0, 6, "CXCUN[") == 0) {
            if (!hasAdditionalOps(unit_string)) {
                char* ptr = nullptr;
                auto num = static_cast<std::uint16_t>(
                    strtol(unit_string.c_str() + 6, &ptr, 0));
                if (*ptr == ']') {
                    return commoditizedUnit(
                        unit_string,
                        precise::generate_custom_count_unit(num),
                        index);
                }
            }
        }
        if (unit_string.compare(0, 6, "EQXUN[") == 0) {
            if (!hasAdditionalOps(unit_string)) {
                char* ptr = nullptr;
                auto num = static_cast<std::uint16_t>(
                    strtol(unit_string.c_str() + 6, &ptr, 0));
                if (*ptr == ']') {
                    return commoditizedUnit(
                        unit_string,
                        precise_unit(precise::custom::equation_unit(num)),
                        index);
                }
            }
        }
    }
    return precise::invalid;
}